

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O0

void GA_Scan_copy64(int g_a,int g_b,int g_sbit,int64_t lo,int64_t hi)

{
  Integer ahi;
  Integer alo;
  Integer s;
  Integer b;
  Integer a;
  Integer in_stack_00000710;
  Integer in_stack_00000718;
  Integer in_stack_00000720;
  Integer in_stack_00000728;
  Integer in_stack_00000730;
  
  pnga_scan_copy(in_stack_00000730,in_stack_00000728,in_stack_00000720,in_stack_00000718,
                 in_stack_00000710);
  return;
}

Assistant:

void GA_Scan_copy64(int g_a, int g_b, int g_sbit, int64_t lo,
                    int64_t hi)
{
     Integer a = (Integer)g_a;
     Integer b = (Integer)g_b;
     Integer s = (Integer)g_sbit;
     Integer alo = lo+1;
     Integer ahi = hi+1;
     wnga_scan_copy(a, b, s, alo, ahi);

}